

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O2

int32 fe_build_melfilters(melfb_t *mel_fb)

{
  ushort uVar1;
  int iVar2;
  int16 *piVar3;
  mfcc_t *pmVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int32 iVar12;
  long lVar13;
  float x;
  float32 fVar14;
  float32 fVar15;
  float32 fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar23;
  uint uVar24;
  float fVar25;
  float32 freqs [3];
  
  piVar3 = (int16 *)__ckd_calloc__((long)mel_fb->num_filters,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                                   ,0x231);
  mel_fb->spec_start = piVar3;
  piVar3 = (int16 *)__ckd_calloc__((long)mel_fb->num_filters,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                                   ,0x233);
  mel_fb->filt_start = piVar3;
  piVar3 = (int16 *)__ckd_calloc__((long)mel_fb->num_filters,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                                   ,0x235);
  mel_fb->filt_width = piVar3;
  x = (float)fe_mel(mel_fb,mel_fb->lower_filt_freq);
  fVar14 = fe_mel(mel_fb,mel_fb->upper_filt_freq);
  fVar18 = ((float)fVar14 - x) / (float)(mel_fb->num_filters + 1);
  if (mel_fb->doublewide == 0) {
    fVar15 = mel_fb->sampling_rate;
LAB_0010f3dc:
    fVar17 = (float)fVar15 / (float)mel_fb->fft_size;
    iVar9 = 0;
    for (lVar13 = 0; lVar13 < mel_fb->num_filters; lVar13 = lVar13 + 1) {
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        fVar14 = fe_melinv(mel_fb,(float32)((float)(((int)lVar10 << (mel_fb->doublewide != 0)) +
                                                   (int)lVar13) * fVar18 + x));
        freqs[lVar10] = fVar14;
        if (mel_fb->round_filters != 0) {
          freqs[lVar10] = (float32)((float)(int)((float)fVar14 / fVar17 + 0.5) * fVar17);
        }
      }
      piVar3 = mel_fb->spec_start;
      piVar3[lVar13] = -1;
      iVar2 = mel_fb->fft_size / 2;
      iVar7 = -1;
      if (-1 < iVar2) {
        iVar7 = iVar2;
      }
      iVar8 = 0xffff;
      for (iVar6 = 0; iVar7 + 1 != iVar6; iVar6 = iVar6 + 1) {
        if ((float)freqs[0] <= (float)iVar6 * fVar17) {
          if ((iVar2 == iVar6) || ((float)freqs[2] < (float)iVar6 * fVar17)) {
            piVar3 = mel_fb->filt_width;
            piVar3[lVar13] = (short)iVar6 - (short)iVar8;
            mel_fb->filt_start[lVar13] = (int16)iVar9;
            iVar9 = iVar9 + piVar3[lVar13];
            break;
          }
          if ((short)iVar8 == -1) {
            piVar3[lVar13] = (short)iVar6;
            iVar8 = iVar6;
          }
        }
      }
    }
    pmVar4 = (mfcc_t *)
             __ckd_malloc__((long)iVar9 << 2,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                            ,0x276);
    mel_fb->filt_coeffs = pmVar4;
    iVar12 = 0;
    lVar13 = 0;
    for (lVar10 = 0; lVar10 < mel_fb->num_filters; lVar10 = lVar10 + 1) {
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        fVar14 = fe_melinv(mel_fb,(float32)((float)(((int)lVar11 << (mel_fb->doublewide != 0)) +
                                                   (int)lVar10) * fVar18 + x));
        freqs[lVar11] = fVar14;
        if (mel_fb->round_filters != 0) {
          freqs[lVar11] = (float32)((float)(int)((float)fVar14 / fVar17 + 0.5) * fVar17);
        }
      }
      uVar1 = mel_fb->filt_width[lVar10];
      fVar19 = 2.0 / ((float)freqs[2] - (float)freqs[0]);
      if ((short)uVar1 < 1) {
        uVar1 = 0;
      }
      lVar13 = (long)(int)lVar13;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        fVar20 = (float)(int)((int)mel_fb->spec_start[lVar10] + uVar5) * fVar17;
        if ((fVar20 < (float)freqs[0]) || ((float)freqs[2] < fVar20)) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                  ,0x291,
                  "Failed to create filterbank, frequency range does not match. Sample rate %f, FFT size %d, lowerf %f < freq %f > upperf %f.\n"
                  ,(double)(float)mel_fb->sampling_rate,(double)(float)freqs[0],(double)fVar20,
                  (double)(float)freqs[2],(ulong)(uint)mel_fb->fft_size);
          exit(1);
        }
        auVar21._0_4_ = fVar20 - (float)freqs[0];
        auVar21._4_4_ = (float)freqs[2] - fVar20;
        auVar21._8_4_ = 0;
        auVar21._12_4_ = 0.0 - (float)freqs[2];
        auVar22._4_4_ = (float)freqs[2] - (float)freqs[1];
        auVar22._0_4_ = (float)freqs[1] - (float)freqs[0];
        auVar22._8_4_ = 0;
        auVar22._12_4_ = 0.0 - (float)freqs[2];
        auVar22 = divps(auVar21,auVar22);
        uVar24 = (uint)(mel_fb->unit_area == 0);
        uVar23 = (int)(uVar24 << 0x1f) >> 0x1f;
        uVar24 = (int)(uVar24 << 0x1f) >> 0x1f;
        fVar20 = (float)(~uVar23 & (uint)(fVar19 * auVar22._0_4_) | (uint)auVar22._0_4_ & uVar23);
        fVar25 = (float)(~uVar24 & (uint)(fVar19 * auVar22._4_4_) | (uint)auVar22._4_4_ & uVar24);
        if (fVar25 <= fVar20) {
          fVar20 = fVar25;
        }
        mel_fb->filt_coeffs[lVar13] = (mfcc_t)fVar20;
        lVar13 = lVar13 + 1;
      }
    }
  }
  else {
    x = x - fVar18;
    fVar15 = fe_melinv(mel_fb,(float32)x);
    if (0.0 <= (float)fVar15) {
      fVar16 = fe_melinv(mel_fb,(float32)((float)fVar14 + fVar18));
      fVar15 = mel_fb->sampling_rate;
      if ((float)fVar16 <= (float)fVar15 * 0.5) goto LAB_0010f3dc;
    }
    fVar15 = fe_melinv(mel_fb,(float32)x);
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
            ,0x245,"Out of Range: low  filter edge = %f (%f)\n",(double)(float)fVar15,0);
    fVar14 = fe_melinv(mel_fb,(float32)((float)fVar14 + fVar18));
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
            ,0x248,"              high filter edge = %f (%f)\n",(double)(float)fVar14,
            (double)((float)mel_fb->sampling_rate * 0.5));
    iVar12 = -10;
  }
  return iVar12;
}

Assistant:

int32
fe_build_melfilters(melfb_t * mel_fb)
{
    float32 melmin, melmax, melbw, fftfreq;
    int n_coeffs, i, j;


    /* Filter coefficient matrix, in flattened form. */
    mel_fb->spec_start =
        ckd_calloc(mel_fb->num_filters, sizeof(*mel_fb->spec_start));
    mel_fb->filt_start =
        ckd_calloc(mel_fb->num_filters, sizeof(*mel_fb->filt_start));
    mel_fb->filt_width =
        ckd_calloc(mel_fb->num_filters, sizeof(*mel_fb->filt_width));

    /* First calculate the widths of each filter. */
    /* Minimum and maximum frequencies in mel scale. */
    melmin = fe_mel(mel_fb, mel_fb->lower_filt_freq);
    melmax = fe_mel(mel_fb, mel_fb->upper_filt_freq);

    /* Width of filters in mel scale */
    melbw = (melmax - melmin) / (mel_fb->num_filters + 1);
    if (mel_fb->doublewide) {
        melmin -= melbw;
        melmax += melbw;
        if ((fe_melinv(mel_fb, melmin) < 0) ||
            (fe_melinv(mel_fb, melmax) > mel_fb->sampling_rate / 2)) {
            E_WARN
                ("Out of Range: low  filter edge = %f (%f)\n",
                 fe_melinv(mel_fb, melmin), 0.0);
            E_WARN
                ("              high filter edge = %f (%f)\n",
                 fe_melinv(mel_fb, melmax), mel_fb->sampling_rate / 2);
            return FE_INVALID_PARAM_ERROR;
        }
    }

    /* DFT point spacing */
    fftfreq = mel_fb->sampling_rate / (float32) mel_fb->fft_size;

    /* Count and place filter coefficients. */
    n_coeffs = 0;
    for (i = 0; i < mel_fb->num_filters; ++i) {
        float32 freqs[3];

        /* Left, center, right frequencies in Hertz */
        for (j = 0; j < 3; ++j) {
            if (mel_fb->doublewide)
                freqs[j] = fe_melinv(mel_fb, (i + j * 2) * melbw + melmin);
            else
                freqs[j] = fe_melinv(mel_fb, (i + j) * melbw + melmin);
            /* Round them to DFT points if requested */
            if (mel_fb->round_filters)
                freqs[j] = ((int) (freqs[j] / fftfreq + 0.5)) * fftfreq;
        }

        /* spec_start is the start of this filter in the power spectrum. */
        mel_fb->spec_start[i] = -1;
        /* There must be a better way... */
        for (j = 0; j < mel_fb->fft_size / 2 + 1; ++j) {
            float32 hz = j * fftfreq;
            if (hz < freqs[0])
                continue;
            else if (hz > freqs[2] || j == mel_fb->fft_size / 2) {
                /* filt_width is the width in DFT points of this filter. */
                mel_fb->filt_width[i] = j - mel_fb->spec_start[i];
                /* filt_start is the start of this filter in the filt_coeffs array. */
                mel_fb->filt_start[i] = n_coeffs;
                n_coeffs += mel_fb->filt_width[i];
                break;
            }
            if (mel_fb->spec_start[i] == -1)
                mel_fb->spec_start[i] = j;
        }
    }

    /* Now go back and allocate the coefficient array. */
    mel_fb->filt_coeffs =
        ckd_malloc(n_coeffs * sizeof(*mel_fb->filt_coeffs));

    /* And now generate the coefficients. */
    n_coeffs = 0;
    for (i = 0; i < mel_fb->num_filters; ++i) {
        float32 freqs[3];

        /* Left, center, right frequencies in Hertz */
        for (j = 0; j < 3; ++j) {
            if (mel_fb->doublewide)
                freqs[j] = fe_melinv(mel_fb, (i + j * 2) * melbw + melmin);
            else
                freqs[j] = fe_melinv(mel_fb, (i + j) * melbw + melmin);
            /* Round them to DFT points if requested */
            if (mel_fb->round_filters)
                freqs[j] = ((int) (freqs[j] / fftfreq + 0.5)) * fftfreq;
        }

        for (j = 0; j < mel_fb->filt_width[i]; ++j) {
            float32 hz, loslope, hislope;

            hz = (mel_fb->spec_start[i] + j) * fftfreq;
            if (hz < freqs[0] || hz > freqs[2]) {
                E_FATAL
                    ("Failed to create filterbank, frequency range does not match. "
                     "Sample rate %f, FFT size %d, lowerf %f < freq %f > upperf %f.\n",
                     mel_fb->sampling_rate, mel_fb->fft_size, freqs[0], hz,
                     freqs[2]);
            }
            loslope = (hz - freqs[0]) / (freqs[1] - freqs[0]);
            hislope = (freqs[2] - hz) / (freqs[2] - freqs[1]);
            if (mel_fb->unit_area) {
                loslope *= 2 / (freqs[2] - freqs[0]);
                hislope *= 2 / (freqs[2] - freqs[0]);
            }
            if (loslope < hislope) {
#ifdef FIXED_POINT
                mel_fb->filt_coeffs[n_coeffs] = fe_log(loslope);
#else
                mel_fb->filt_coeffs[n_coeffs] = loslope;
#endif
            }
            else {
#ifdef FIXED_POINT
                mel_fb->filt_coeffs[n_coeffs] = fe_log(hislope);
#else
                mel_fb->filt_coeffs[n_coeffs] = hislope;
#endif
            }
            ++n_coeffs;
        }
    }

    return FE_SUCCESS;
}